

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManagedStatic.h
# Opt level: O0

void llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call(void *Ptr)

{
  void *Ptr_local;
  
  if (Ptr != (void *)0x0) {
    anon_unknown.dwarf_f773b::CommandLineParser::~CommandLineParser((CommandLineParser *)Ptr);
    operator_delete(Ptr,0x130);
  }
  return;
}

Assistant:

static void call(void *Ptr) { delete (T *)Ptr; }